

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Compiler::CaptureLiterals(Compiler *this,Node *root,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  char16_t *local_78;
  TrackAllocData local_50;
  uint local_24;
  Char *pCStack_20;
  CharCount finalLen;
  Char *litbuf_local;
  Node *root_local;
  Compiler *this_local;
  
  pCStack_20 = litbuf;
  litbuf_local = (Char *)root;
  root_local = (Node *)this;
  uVar3 = (*root->_vptr_Node[3])(root,this,litbuf);
  local_24 = uVar3;
  uVar4 = (*(code *)**(undefined8 **)litbuf_local)();
  if (uVar3 < uVar4) {
    Js::Throw::OutOfMemory();
  }
  if (local_24 == 0) {
    local_78 = (char16_t *)0x0;
  }
  else {
    pRVar5 = Js::ScriptContext::GetRecycler(this->scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&char16_t::typeinfo,0,(ulong)local_24,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
               ,0x11c6);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
    local_78 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)local_24
                         );
  }
  Memory::WriteBarrierPtr<char16_t>::operator=(&(this->program->rep).insts.litbuf,local_78);
  (this->program->rep).insts.litbufLen = 0;
  (**(code **)(*(long *)litbuf_local + 0x20))(litbuf_local,this,pCStack_20);
  if ((this->program->rep).insts.litbufLen != local_24) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x11ca,"(program->rep.insts.litbufLen == finalLen)",
                       "program->rep.insts.litbufLen == finalLen");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void Compiler::CaptureLiterals(Node* root, const Char* litbuf)
    {
        // Program will own literal buffer. Prepare buffer and nodes for case-invariant matching if necessary.
        CharCount finalLen = root->TransferPass0(*this, litbuf);
        if (finalLen < root->LiteralLength()) // overflowed
        {
            Js::Throw::OutOfMemory();
        }

        program->rep.insts.litbuf = finalLen == 0 ? 0 : RecyclerNewArrayLeaf(scriptContext->GetRecycler(), Char, finalLen);

        program->rep.insts.litbufLen = 0;
        root->TransferPass1(*this, litbuf);
        Assert(program->rep.insts.litbufLen == finalLen);
    }